

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

unsigned_long_long qpdf_oh_get_uint_value(qpdf_data qpdf,qpdf_oh oh)

{
  undefined1 this [8];
  uint uVar1;
  char *cstr;
  Pipeline *this_00;
  qpdf_error_code_e local_130 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  undefined1 local_120 [8];
  function<unsigned_long_long_(_qpdf_data_*)> local_118;
  unsigned_long_long ret;
  int local_ec;
  undefined1 local_e8 [16];
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  long local_78;
  undefined8 uStack_70;
  qpdf_oh local_68;
  undefined8 local_60;
  function<unsigned_long_long_()> local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = &local_60;
  local_60 = 0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<unsigned_long_long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  local_e8._0_8_ = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<unsigned_long_long_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1205:55)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<unsigned_long_long_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1205:55)>
             ::_M_manager;
  std::function<unsigned_long_long_()>::function
            (&local_58,(function<unsigned_long_long_()> *)&local_38);
  std::function<unsigned_long_long_(QPDFObjectHandle_&)>::function
            ((function<unsigned_long_long_(QPDFObjectHandle_&)> *)&local_88,
             (function<unsigned_long_long_(QPDFObjectHandle_&)> *)local_e8);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_68 = oh;
  local_c8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_c8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = uStack_70;
  if (local_78 != 0) {
    *(void **)local_c8._M_unused._0_8_ = local_88._M_unused._M_object;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = local_88._8_8_;
    *(long *)((long)local_c8._M_unused._0_8_ + 0x10) = local_78;
    local_78 = 0;
    uStack_70 = 0;
  }
  *(qpdf_oh *)((long)local_c8._M_unused._0_8_ + 0x20) = oh;
  pcStack_b0 = std::
               _Function_handler<unsigned_long_long_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<unsigned_long_long_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_120 = (undefined1  [8])&ret;
  std::function<unsigned_long_long_(_qpdf_data_*)>::function
            (&local_118,(function<unsigned_long_long_(_qpdf_data_*)> *)&local_c8);
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_a8._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_a8._M_unused._0_8_ = local_120;
  *(long *)((long)local_a8._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_a8._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_a8._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_a8._M_unused._0_8_ + 0x20) = local_118._M_invoker;
  if (local_118.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)((long)local_a8._M_unused._0_8_ + 8) =
         local_118.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) =
         local_118.super__Function_base._M_functor._8_8_;
    *(_Manager_type *)((long)local_a8._M_unused._0_8_ + 0x18) =
         local_118.super__Function_base._M_manager;
    local_118.super__Function_base._M_manager = (_Manager_type)0x0;
    local_118._M_invoker = (_Invoker_type)0x0;
  }
  pcStack_90 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::_Function_base::~_Function_base(&local_118.super__Function_base);
  if (1 < uVar1) {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_130[0] = qpdf_e_internal;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_120,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_ec = 0;
        std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
        emplace_back<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                  ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   (char (*) [1])0x229c66,&local_ec,
                   (char (*) [129])
                   "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                  );
        std::__cxx11::string::~string((string *)local_120);
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_120,SUB41(local_130[0],0));
      this = local_120;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128);
    }
    ret = std::function<unsigned_long_long_()>::operator()(&local_58);
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return ret;
}

Assistant:

unsigned long long
qpdf_oh_get_uint_value(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<unsigned long long>(
        qpdf, oh, return_T<unsigned long long>(0ULL), [](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_uint_value");
            return o.getUIntValue();
        });
}